

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec16.c
# Opt level: O3

void If_CluSwapAdjacent(word *pOut,word *pIn,int iVar,int nVars)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  byte bVar5;
  ulong uVar6;
  int iVar7;
  int iVar8;
  word *pwVar9;
  int iVar10;
  ulong uVar11;
  uint uVar12;
  word *pwVar13;
  int iVar14;
  ulong uVar15;
  word *pwVar16;
  word *pwVar17;
  word *pwVar18;
  word *pwVar19;
  
  uVar11 = (ulong)(uint)(1 << ((char)nVars - 6U & 0x1f));
  if (nVars < 7) {
    uVar11 = 1;
  }
  if (nVars + -1 <= iVar) {
    __assert_fail("iVar < nVars - 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDec16.c"
                  ,0x195,"void If_CluSwapAdjacent(word *, word *, int, int)");
  }
  iVar10 = (int)uVar11;
  if (iVar < 5) {
    if (0 < iVar10) {
      uVar6 = PMasks[iVar][0];
      uVar1 = PMasks[iVar][1];
      uVar2 = PMasks[iVar][2];
      uVar15 = 0;
      do {
        uVar3 = pIn[uVar15];
        bVar5 = (byte)(1 << ((byte)iVar & 0x1f));
        pOut[uVar15] = (uVar3 & uVar2) >> (bVar5 & 0x3f) |
                       (uVar1 & uVar3) << (bVar5 & 0x3f) | uVar6 & uVar3;
        uVar15 = uVar15 + 1;
      } while (uVar11 != uVar15);
    }
  }
  else if (iVar == 5) {
    if (0 < iVar10) {
      uVar6 = 0;
      do {
        pOut[uVar6] = pIn[uVar6 + 1] << 0x20 | (ulong)(uint)pIn[uVar6];
        pOut[uVar6 + 1] =
             CONCAT44(*(undefined4 *)((long)pIn + uVar6 * 8 + 0xc),
                      *(undefined4 *)((long)pIn + uVar6 * 8 + 4));
        uVar6 = uVar6 + 2;
      } while (uVar6 < uVar11);
    }
  }
  else if (0 < iVar10) {
    iVar7 = iVar + -6;
    bVar5 = (byte)iVar7;
    uVar12 = 1 << (bVar5 & 0x1f);
    iVar14 = 2 << (bVar5 & 0x1f);
    iVar8 = 3 << (bVar5 & 0x1f);
    iVar4 = 4 << (bVar5 & 0x1f);
    uVar11 = 1;
    if (1 < (int)uVar12) {
      uVar11 = (ulong)uVar12;
    }
    pwVar13 = pOut + (int)uVar12;
    pwVar16 = pIn + iVar14;
    pwVar9 = pOut + iVar14;
    pwVar18 = pIn + (int)uVar12;
    pwVar19 = pIn + iVar8;
    pwVar17 = pOut + iVar8;
    iVar8 = 0;
    do {
      if (iVar7 != 0x1f) {
        uVar6 = 0;
        do {
          pOut[uVar6] = pIn[uVar6];
          uVar6 = uVar6 + 1;
        } while (uVar11 != uVar6);
        if (iVar7 != 0x1f) {
          uVar6 = 0;
          do {
            pwVar13[uVar6] = pwVar16[uVar6];
            uVar6 = uVar6 + 1;
          } while (uVar11 != uVar6);
          if (iVar7 != 0x1f) {
            uVar6 = 0;
            do {
              pwVar9[uVar6] = pwVar18[uVar6];
              uVar6 = uVar6 + 1;
            } while (uVar11 != uVar6);
            if (iVar7 != 0x1f) {
              uVar6 = 0;
              do {
                pwVar17[uVar6] = pwVar19[uVar6];
                uVar6 = uVar6 + 1;
              } while (uVar11 != uVar6);
            }
          }
        }
      }
      iVar8 = iVar8 + iVar4;
      pOut = pOut + iVar4;
      pIn = pIn + iVar4;
      pwVar13 = pwVar13 + iVar4;
      pwVar16 = pwVar16 + iVar4;
      pwVar9 = pwVar9 + iVar4;
      pwVar18 = pwVar18 + iVar4;
      pwVar19 = pwVar19 + iVar4;
      pwVar17 = pwVar17 + iVar4;
    } while (iVar8 < iVar10);
  }
  return;
}

Assistant:

static inline void If_CluSwapAdjacent( word * pOut, word * pIn, int iVar, int nVars )
{
    int i, k, nWords = If_CluWordNum( nVars );
    assert( iVar < nVars - 1 );
    if ( iVar < 5 )
    {
        int Shift = (1 << iVar);
        for ( i = 0; i < nWords; i++ )
            pOut[i] = (pIn[i] & PMasks[iVar][0]) | ((pIn[i] & PMasks[iVar][1]) << Shift) | ((pIn[i] & PMasks[iVar][2]) >> Shift);
    }
    else if ( iVar > 5 )
    {
        int Step = (1 << (iVar - 6));
        for ( k = 0; k < nWords; k += 4*Step )
        {
            for ( i = 0; i < Step; i++ )
                pOut[i] = pIn[i];
            for ( i = 0; i < Step; i++ )
                pOut[Step+i] = pIn[2*Step+i];
            for ( i = 0; i < Step; i++ )
                pOut[2*Step+i] = pIn[Step+i];
            for ( i = 0; i < Step; i++ )
                pOut[3*Step+i] = pIn[3*Step+i];
            pIn  += 4*Step;
            pOut += 4*Step;
        }
    }
    else // if ( iVar == 5 )
    {
        for ( i = 0; i < nWords; i += 2 )
        {
            pOut[i]   = (pIn[i]   & ABC_CONST(0x00000000FFFFFFFF)) | ((pIn[i+1] & ABC_CONST(0x00000000FFFFFFFF)) << 32);
            pOut[i+1] = (pIn[i+1] & ABC_CONST(0xFFFFFFFF00000000)) | ((pIn[i]   & ABC_CONST(0xFFFFFFFF00000000)) >> 32);
        }
    }
}